

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaKrylovDemo_ls.c
# Opt level: O2

int SetInitialProfile(UserData data,N_Vector uu,N_Vector up,N_Vector res)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  sunrealtype tt;
  double dVar7;
  double dVar8;
  
  lVar1 = data->mm;
  lVar2 = N_VGetArrayPointer(uu);
  lVar3 = N_VGetArrayPointer(up);
  lVar5 = 0;
  lVar6 = 0;
  if (0 < lVar1) {
    lVar6 = lVar1;
  }
  for (; lVar5 != lVar6; lVar5 = lVar5 + 1) {
    dVar7 = (double)lVar5 * data->dx;
    for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
      dVar8 = (double)lVar4 * data->dx;
      *(double *)(lVar2 + lVar4 * 8) = (1.0 - dVar8) * dVar8 * 16.0 * dVar7 * (1.0 - dVar7);
    }
    lVar2 = lVar2 + lVar1 * 8;
  }
  tt = (sunrealtype)N_VConst(0,up);
  resHeat(tt,uu,up,res,data);
  N_VScale(0xbff0000000000000,res,up);
  for (lVar2 = 0; lVar2 != lVar6; lVar2 = lVar2 + 1) {
    for (lVar5 = 0; lVar1 != lVar5; lVar5 = lVar5 + 1) {
      if ((((lVar2 == 0) || (lVar1 + -1 == lVar5)) || (lVar2 == lVar1 + -1)) || (lVar5 == 0)) {
        *(undefined8 *)(lVar3 + lVar5 * 8) = 0;
      }
    }
    lVar3 = lVar3 + lVar1 * 8;
  }
  return (int)lVar2;
}

Assistant:

static int SetInitialProfile(UserData data, N_Vector uu, N_Vector up, N_Vector res)
{
  sunindextype mm, mm1, i, j, offset, loc;
  sunrealtype xfact, yfact, *udata, *updata;

  mm = data->mm;

  udata  = N_VGetArrayPointer(uu);
  updata = N_VGetArrayPointer(up);

  /* Initialize uu on all grid points. */
  mm1 = mm - 1;
  for (j = 0; j < mm; j++)
  {
    yfact  = data->dx * j;
    offset = mm * j;
    for (i = 0; i < mm; i++)
    {
      xfact      = data->dx * i;
      loc        = offset + i;
      udata[loc] = SUN_RCONST(16.0) * xfact * (ONE - xfact) * yfact *
                   (ONE - yfact);
    }
  }

  /* Initialize up vector to 0. */
  N_VConst(ZERO, up);

  /* resHeat sets res to negative of ODE RHS values at interior points. */
  resHeat(ZERO, uu, up, res, data);

  /* Copy -res into up to get correct interior initial up values. */
  N_VScale(-ONE, res, up);

  /* Set up at boundary points to zero. */
  for (j = 0; j < mm; j++)
  {
    offset = mm * j;
    for (i = 0; i < mm; i++)
    {
      loc = offset + i;
      if (j == 0 || j == mm1 || i == 0 || i == mm1) { updata[loc] = ZERO; }
    }
  }

  return (0);
}